

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_sha256.c
# Opt level: O0

int tc_sha256_update(TCSha256State_t s,uint8_t *data,size_t datalen)

{
  uint8_t uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t local_28;
  size_t datalen_local;
  uint8_t *data_local;
  TCSha256State_t s_local;
  
  if ((s == (TCSha256State_t)0x0) || (data == (uint8_t *)0x0)) {
    s_local._4_4_ = 0;
  }
  else {
    local_28 = datalen;
    datalen_local = (size_t)data;
    if (datalen == 0) {
      s_local._4_4_ = 1;
    }
    else {
      while (sVar3 = local_28 - 1, local_28 != 0) {
        sVar4 = datalen_local + 1;
        uVar1 = *(uint8_t *)datalen_local;
        sVar2 = s->leftover_offset;
        s->leftover_offset = sVar2 + 1;
        s->leftover[sVar2] = uVar1;
        local_28 = sVar3;
        datalen_local = sVar4;
        if (0x3f < s->leftover_offset) {
          compress(s->iv,s->leftover);
          s->leftover_offset = 0;
          s->bits_hashed = s->bits_hashed + 0x200;
        }
      }
      s_local._4_4_ = 1;
    }
  }
  return s_local._4_4_;
}

Assistant:

int tc_sha256_update(TCSha256State_t s, const uint8_t *data, size_t datalen)
{
	/* input sanity check: */
	if (s == (TCSha256State_t) 0 ||
	    data == (void *) 0) {
		return TC_CRYPTO_FAIL;
                printf("tc_sha256_update failed, input sanity check.\n");
	} else if (datalen == 0) {
		return TC_CRYPTO_SUCCESS;
	}

	while (datalen-- > 0) {
		s->leftover[s->leftover_offset++] = *(data++);
		if (s->leftover_offset >= TC_SHA256_BLOCK_SIZE) {
			compress(s->iv, s->leftover);
			s->leftover_offset = 0;
			s->bits_hashed += (TC_SHA256_BLOCK_SIZE << 3);
		}
	}

	return TC_CRYPTO_SUCCESS;
}